

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::writeOptions(Highs *this,string *filename,bool report_only_deviations)

{
  HighsLogOptions *log_options_;
  bool bVar1;
  HighsStatus HVar2;
  HighsStatus call_status;
  allocator local_15e;
  allocator local_15d;
  HighsFileType file_type;
  string local_158;
  FILE *file;
  string local_130;
  string local_110;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  logHeader(this);
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&local_90,log_options_);
  std::__cxx11::string::string((string *)&local_110,(string *)filename);
  std::__cxx11::string::string((string *)&local_130,"writeOptions",&local_15e);
  HVar2 = openWriteFile(this,&local_110,&local_130,&file,&file_type);
  std::__cxx11::string::string((string *)&local_158,"openWriteFile",&local_15d);
  HVar2 = interpretCallStatus(&local_90,HVar2,kOk,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  if (HVar2 == kError) {
    HVar2 = kError;
  }
  else {
    bVar1 = std::operator==(filename,"");
    if (bVar1) {
      file_type = kMinimal;
    }
    bVar1 = std::operator!=(filename,"");
    if (bVar1) {
      highsLogUser(log_options_,kInfo,"Writing the option values to %s\n",
                   (filename->_M_dataplus)._M_p);
    }
    HighsLogOptions::HighsLogOptions(&local_f0,log_options_);
    call_status = writeOptionsToFile(file,log_options_,&(this->options_).records,
                                     report_only_deviations,file_type);
    std::__cxx11::string::string((string *)&local_158,"writeOptionsToFile",&local_15e);
    HVar2 = interpretCallStatus(&local_f0,call_status,HVar2,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
    if (file != _stdout) {
      fclose((FILE *)file);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::writeOptions(const std::string& filename,
                                const bool report_only_deviations) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  FILE* file;
  HighsFileType file_type;
  return_status = interpretCallStatus(
      options_.log_options,
      openWriteFile(filename, "writeOptions", file, file_type), return_status,
      "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  if (filename == "") file_type = HighsFileType::kMinimal;
  // Report to user that options are being written to a file
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the option values to %s\n", filename.c_str());
  return_status = interpretCallStatus(
      options_.log_options,
      writeOptionsToFile(file, options_.log_options, options_.records,
                         report_only_deviations, file_type),
      return_status, "writeOptionsToFile");
  if (file != stdout) fclose(file);
  return return_status;
}